

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

string * ot::commissioner::utils::Hex<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short aInteger)

{
  ByteArray *aBytes;
  ByteArray local_88;
  string local_70;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unsigned_short local_12;
  string *psStack_10;
  unsigned_short aInteger_local;
  
  local_12 = aInteger;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"0x",&local_39);
  Encode<unsigned_short>(&local_88,local_12);
  Hex_abi_cxx11_(&local_70,(utils *)&local_88,aBytes);
  std::operator+(__return_storage_ptr__,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string Hex(T aInteger)
{
    return std::string("0x") + Hex(Encode(aInteger));
}